

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O1

ANNpoint annAllocPt(int dim,ANNcoord c)

{
  undefined1 auVar1 [16];
  ANNpoint pAVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar4 = (long)dim * 8;
  }
  pAVar2 = (ANNpoint)operator_new__(uVar4);
  auVar1 = _DAT_0010a260;
  if (0 < dim) {
    lVar3 = (ulong)(uint)dim - 1;
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0010a260;
    auVar6 = _DAT_0010a090;
    do {
      auVar8 = auVar6 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(ANNcoord *)((long)pAVar2 + lVar3) = c;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(ANNcoord *)((long)pAVar2 + lVar3 + 8) = c;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(dim + 1U >> 1) << 4 != lVar3);
  }
  return pAVar2;
}

Assistant:

ANNpoint annAllocPt(int dim, ANNcoord c)  // allocate 1 point
{
    ANNpoint p = new ANNcoord[dim];
    for (int i = 0; i < dim; i++) p[i] = c;
    return p;
}